

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
qclab::QCircuit<float,_qclab::QObject<float>_>::qubits
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          QCircuit<float,_qclab::QObject<float>_> *this)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  allocator_type local_11;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)this->nbQubits_,&local_11);
  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar2 != piVar1) {
    iVar3 = this->offset_;
    do {
      *piVar2 = iVar3;
      iVar3 = iVar3 + 1;
      piVar2 = piVar2 + 1;
    } while (piVar2 != piVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< int > qubits() const override {
        std::vector< int > v( nbQubits_ ) ;
        std::iota( v.begin() , v.end() , offset_ ) ;
        return v ;
      }